

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

QAbstractItemModel * createTreeModel(QObject *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QStandardItemModel *pQVar5;
  QLatin1Char local_387;
  QChar local_386;
  QLatin1Char local_383;
  QChar local_382;
  QLatin1Char local_37f;
  QChar local_37e;
  QLatin1Char local_37b;
  QChar local_37a;
  QArrayDataPointer<char16_t> local_378;
  QString local_360;
  QString local_348;
  QString local_330;
  QString local_318;
  QString local_300;
  QVariant local_2e8;
  undefined1 local_2c8 [24];
  int local_2b0;
  int local_2ac;
  int h_1;
  int j_1;
  QModelIndex grandParIdx;
  QLatin1Char local_287;
  QChar local_286;
  QLatin1Char local_283;
  QChar local_282;
  QArrayDataPointer<char16_t> local_280;
  QString local_268;
  QString local_250;
  QString local_238;
  QString local_220;
  QVariant local_208;
  undefined1 local_1e8 [24];
  int local_1d0;
  int local_1cc;
  int h;
  int k;
  undefined1 local_1b0 [8];
  QModelIndex parIdx;
  QArrayDataPointer<char16_t> local_190;
  QString local_178;
  QString local_160;
  QString local_148;
  QVariant local_130;
  QModelIndex local_110;
  undefined1 local_f8 [24];
  QModelIndex local_e0;
  int local_c4;
  int j;
  int local_a4;
  int i;
  QModelIndex local_88;
  QStandardItemModel *local_60;
  QAbstractItemModel *result;
  QObject *parent_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_10;
  
  local_60 = (QStandardItemModel *)0x0;
  result = (QAbstractItemModel *)parent;
  pQVar5 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar5,(QObject *)result);
  local_60 = pQVar5;
  QModelIndex::QModelIndex(&local_88);
  (**(code **)(*(long *)pQVar5 + 0x100))(pQVar5,0,3,&local_88);
  pQVar5 = local_60;
  QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff60);
  (**(code **)(*(long *)pQVar5 + 0xf8))(pQVar5,0,3,&stack0xffffffffffffff60);
  local_a4 = 0;
  while( true ) {
    pQVar5 = local_60;
    iVar1 = local_a4;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffff40);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&stack0xffffffffffffff40);
    if (iVar3 <= iVar1) break;
    local_c4 = 0;
    while( true ) {
      pQVar5 = local_60;
      iVar1 = local_c4;
      QModelIndex::QModelIndex(&local_e0);
      iVar4 = (**(code **)(*(long *)pQVar5 + 0x80))(pQVar5,&local_e0);
      pQVar5 = local_60;
      iVar2 = local_a4;
      iVar3 = local_c4;
      if (iVar4 <= iVar1) break;
      QModelIndex::QModelIndex(&local_110);
      (**(code **)(*(long *)pQVar5 + 0x60))(local_f8,pQVar5,iVar2,iVar3,&local_110);
      str = L"%1,%2";
      parent_local = (QObject *)anon_var_dwarf_11e19;
      local_40 = &local_190;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_190,(Data *)0x0,L"%1,%2",5);
      QString::QString(&local_178,&local_190);
      iVar1 = local_a4;
      QLatin1Char::QLatin1Char((QLatin1Char *)((long)&parIdx.m + 5),' ');
      QChar::QChar((QChar *)((long)&parIdx.m + 6),parIdx.m._5_1_);
      QString::arg(&local_160,&local_178,iVar1,0,10,parIdx.m._6_2_);
      iVar1 = local_c4;
      QLatin1Char::QLatin1Char((QLatin1Char *)((long)&parIdx.m + 1),' ');
      QChar::QChar((QChar *)((long)&parIdx.m + 2),parIdx.m._1_1_);
      QString::arg(&local_148,&local_160,iVar1,0,10,parIdx.m._2_2_);
      QVariant::QVariant(&local_130,(QString *)&local_148);
      (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_f8,&local_130,2);
      QVariant::~QVariant(&local_130);
      QString::~QString(&local_148);
      QString::~QString(&local_160);
      QString::~QString(&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
      local_c4 = local_c4 + 1;
    }
    QModelIndex::QModelIndex((QModelIndex *)&h);
    (**(code **)(*(long *)pQVar5 + 0x60))(local_1b0,pQVar5,iVar2,0,&h);
    (**(code **)(*(long *)local_60 + 0x100))(local_60,0,2,local_1b0);
    (**(code **)(*(long *)local_60 + 0xf8))(local_60,0,4,local_1b0);
    local_1cc = 0;
    while( true ) {
      iVar1 = local_1cc;
      iVar3 = (**(code **)(*(long *)local_60 + 0x78))(local_60,local_1b0);
      if (iVar3 <= iVar1) break;
      local_1d0 = 0;
      while( true ) {
        iVar1 = local_1d0;
        iVar3 = (**(code **)(*(long *)local_60 + 0x80))(local_60,local_1b0);
        pQVar5 = local_60;
        if (iVar3 <= iVar1) break;
        (**(code **)(*(long *)local_60 + 0x60))(local_1e8,local_60,local_1cc,local_1d0,local_1b0);
        str_1 = L"%1,%2,%3";
        local_38 = L"%1,%2,%3";
        local_28 = &local_280;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_280,(Data *)0x0,L"%1,%2,%3",8);
        QString::QString(&local_268,&local_280);
        iVar1 = local_a4;
        QLatin1Char::QLatin1Char(&local_283,' ');
        QChar::QChar(&local_282,local_283);
        QString::arg(&local_250,&local_268,iVar1,0,10,local_282);
        iVar1 = local_1cc;
        QLatin1Char::QLatin1Char(&local_287,' ');
        QChar::QChar(&local_286,local_287);
        QString::arg(&local_238,&local_250,iVar1,0,10,local_286);
        iVar1 = local_1d0;
        QLatin1Char::QLatin1Char((QLatin1Char *)((long)&grandParIdx.m + 5),' ');
        QChar::QChar((QChar *)((long)&grandParIdx.m + 6),grandParIdx.m._5_1_);
        QString::arg(&local_220,&local_238,iVar1,0,10,grandParIdx.m._6_2_);
        QVariant::QVariant(&local_208,(QString *)&local_220);
        (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_1e8,&local_208,2);
        QVariant::~QVariant(&local_208);
        QString::~QString(&local_220);
        QString::~QString(&local_238);
        QString::~QString(&local_250);
        QString::~QString(&local_268);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_280);
        local_1d0 = local_1d0 + 1;
      }
      (**(code **)(*(long *)local_60 + 0x60))(&h_1,local_60,local_a4,0,local_1b0);
      (**(code **)(*(long *)local_60 + 0x100))(local_60,0,2,&h_1);
      (**(code **)(*(long *)local_60 + 0xf8))(local_60,0,6,&h_1);
      local_2ac = 0;
      while( true ) {
        iVar1 = local_2ac;
        iVar3 = (**(code **)(*(long *)local_60 + 0x78))(local_60,&h_1);
        if (iVar3 <= iVar1) break;
        local_2b0 = 0;
        while( true ) {
          iVar1 = local_2b0;
          iVar3 = (**(code **)(*(long *)local_60 + 0x80))(local_60,&h_1);
          pQVar5 = local_60;
          if (iVar3 <= iVar1) break;
          (**(code **)(*(long *)local_60 + 0x60))(local_2c8,local_60,local_2ac,local_2b0,&h_1);
          str_2 = L"%1,%2,%3,%4";
          local_20 = L"%1,%2,%3,%4";
          local_10 = &local_378;
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_378,(Data *)0x0,L"%1,%2,%3,%4",0xb);
          QString::QString(&local_360,&local_378);
          iVar1 = local_a4;
          QLatin1Char::QLatin1Char(&local_37b,' ');
          QChar::QChar(&local_37a,local_37b);
          QString::arg(&local_348,&local_360,iVar1,0,10,local_37a);
          iVar1 = local_1cc;
          QLatin1Char::QLatin1Char(&local_37f,' ');
          QChar::QChar(&local_37e,local_37f);
          QString::arg(&local_330,&local_348,iVar1,0,10,local_37e);
          iVar1 = local_2ac;
          QLatin1Char::QLatin1Char(&local_383,' ');
          QChar::QChar(&local_382,local_383);
          QString::arg(&local_318,&local_330,iVar1,0,10,local_382);
          iVar1 = local_2b0;
          QLatin1Char::QLatin1Char(&local_387,' ');
          QChar::QChar(&local_386,local_387);
          QString::arg(&local_300,&local_318,iVar1,0,10,local_386);
          QVariant::QVariant(&local_2e8,(QString *)&local_300);
          (**(code **)(*(long *)pQVar5 + 0x98))(pQVar5,local_2c8,&local_2e8,2);
          QVariant::~QVariant(&local_2e8);
          QString::~QString(&local_300);
          QString::~QString(&local_318);
          QString::~QString(&local_330);
          QString::~QString(&local_348);
          QString::~QString(&local_360);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_378);
          local_2b0 = local_2b0 + 1;
        }
        local_2ac = local_2ac + 1;
      }
      local_1cc = local_1cc + 1;
    }
    local_a4 = local_a4 + 1;
  }
  return (QAbstractItemModel *)local_60;
}

Assistant:

QAbstractItemModel *createTreeModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertColumns(0, 3);
    result->insertRows(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j)
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j));
        const QModelIndex parIdx = result->index(i, 0);
        result->insertColumns(0, 2, parIdx);
        result->insertRows(0, 4, parIdx);
        for (int k = 0; k < result->rowCount(parIdx); ++k) {
            for (int h = 0; h < result->columnCount(parIdx); ++h)
                result->setData(result->index(k, h, parIdx), QStringLiteral("%1,%2,%3").arg(i).arg(k).arg(h));
            const QModelIndex grandParIdx = result->index(i, 0, parIdx);
            result->insertColumns(0, 2, grandParIdx);
            result->insertRows(0, 6, grandParIdx);
            for (int j = 0; j < result->rowCount(grandParIdx); ++j) {
                for (int h = 0; h < result->columnCount(grandParIdx); ++h)
                    result->setData(result->index(j, h, grandParIdx), QStringLiteral("%1,%2,%3,%4").arg(i).arg(k).arg(j).arg(h));
            }
        }
    }
#endif
    return result;
}